

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis<float,double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_48;
  
  if (missing_action == Fail) {
    dVar5 = 0.0;
    auVar21 = ZEXT816(0);
    dVar12 = 0.0;
    local_48 = 0.0;
    lVar4 = 0;
    while( true ) {
      dVar19 = auVar21._0_8_;
      if (end < st + lVar4) break;
      lVar2 = lVar4 + 1;
      auVar15._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar15._0_8_ = lVar2;
      auVar15._12_4_ = 0x45300000;
      dVar13 = (auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
      dVar14 = ((double)x[ix_arr[st + lVar4]] - dVar5) / dVar13;
      auVar18._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar18._0_8_ = lVar4;
      auVar18._12_4_ = 0x45300000;
      dVar17 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * dVar14 *
               ((double)x[ix_arr[st + lVar4]] - dVar5);
      local_48 = local_48 +
                 dVar14 * -4.0 * dVar12 +
                 dVar14 * dVar14 * 6.0 * dVar19 +
                 (dVar13 * dVar13 + dVar13 * -3.0 + 3.0) * dVar14 * dVar14 * dVar17;
      dVar5 = dVar5 + dVar14;
      dVar12 = dVar12 + dVar14 * -3.0 * dVar19 + (dVar13 + -2.0) * dVar14 * dVar17;
      auVar21._0_8_ = dVar19 + dVar17;
      lVar4 = lVar2;
    }
    if (((!NAN(dVar19)) &&
        ((uint)((ulong)((long)ABS(dVar19) + -0x10000000000000) >> 0x35) < 0x3ff && (long)dVar19 < 0
         || ((auVar21 & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
            (long)ABS(dVar19) - 1U < 0xfffffffffffff && (long)dVar19 < 0))) &&
       (bVar1 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,Fail), !bVar1)) {
      return -INFINITY;
    }
    lVar4 = (end - st) + 1;
    auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = 0x45300000;
    auVar8._0_8_ = (auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    auVar8._8_8_ = local_48;
    auVar22._8_8_ = dVar19;
    auVar22._0_8_ = dVar19;
    auVar21 = divpd(auVar8,auVar22);
    dVar5 = auVar21._8_8_ * auVar21._0_8_;
  }
  else {
    dVar5 = 0.0;
    dVar12 = 0.0;
    local_48 = 0.0;
    dVar19 = 0.0;
    lVar4 = 0;
    sVar3 = st;
    while( true ) {
      uVar11 = (undefined4)((ulong)lVar4 >> 0x20);
      if (end < sVar3) break;
      lVar2 = lVar4;
      if ((uint)ABS(x[ix_arr[sVar3]]) < 0x7f800000) {
        lVar2 = lVar4 + 1;
        auVar16._8_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar16._0_8_ = lVar2;
        auVar16._12_4_ = 0x45300000;
        dVar13 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
        dVar17 = (double)x[ix_arr[sVar3]] - dVar5;
        dVar14 = dVar17 / dVar13;
        auVar9._8_4_ = uVar11;
        auVar9._0_8_ = lVar4;
        auVar9._12_4_ = 0x45300000;
        dVar17 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * dVar14 * dVar17;
        dVar19 = dVar19 + dVar14 * -4.0 * dVar12 +
                          dVar14 * dVar14 * 6.0 * local_48 +
                          (dVar13 * dVar13 + dVar13 * -3.0 + 3.0) * dVar14 * dVar14 * dVar17;
        dVar5 = dVar5 + dVar14;
        dVar12 = dVar12 + dVar14 * -3.0 * local_48 + (dVar13 + -2.0) * dVar14 * dVar17;
        local_48 = local_48 + dVar17;
      }
      sVar3 = sVar3 + 1;
      lVar4 = lVar2;
    }
    if (lVar4 == 0) {
      return -INFINITY;
    }
    if (((!NAN(local_48)) &&
        ((uint)((long)ABS(local_48) + 0xfff0000000000000U >> 0x35) < 0x3ff && (long)local_48 < 0 ||
         (ABS(local_48) == 0.0 || (long)ABS(local_48) - 1U < 0xfffffffffffff && (long)local_48 < 0))
        ) && (bVar1 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,missing_action),
             !bVar1)) {
      return -INFINITY;
    }
    auVar10._0_8_ = (double)CONCAT44(0x43300000,(int)lVar4);
    auVar10._8_4_ = uVar11;
    auVar10._12_4_ = 0x45300000;
    auVar20._8_8_ = (auVar10._8_8_ - 1.9342813113834067e+25) + (auVar10._0_8_ - 4503599627370496.0);
    auVar20._0_8_ = dVar19;
    auVar7._8_8_ = local_48;
    auVar7._0_8_ = local_48;
    auVar21 = divpd(auVar20,auVar7);
    dVar5 = auVar21._8_8_ * auVar21._0_8_;
  }
  if (0x7fefffffffffffff < (ulong)ABS(dVar5)) {
    return -INFINITY;
  }
  if (dVar5 <= 0.0) {
    return 0.0;
  }
  return dVar5;
}

Assistant:

double calc_kurtosis(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff, n;
    ldouble_safe out;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            n  =  (ldouble_safe)(row - st + 1);

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * (ldouble_safe)(row - st));

            m   +=  delta_div;
            M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
            M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
            M2  +=  diff;
        }

        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)(end - st + 1) / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }

    else
    {
        size_t cnt = 0;
        for (size_t row = st; row <= end; row++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[row]])))
            {
                cnt++;
                n = (ldouble_safe) cnt;

                delta      =  x[ix_arr[row]] - m;
                delta_div  =  delta / n;
                delta_s    =  delta_div * delta_div;
                diff       =  delta * (delta_div * (ldouble_safe)(cnt - 1));

                m   +=  delta_div;
                M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
                M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
                M2  +=  diff;
            }
        }

        if (unlikely(cnt == 0)) return -HUGE_VAL;
        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)cnt / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }
}